

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

uint32_t map_hash_key(JSContext *ctx,JSValue key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  
  uVar3 = (uint)ctx;
  uVar1 = key.u._0_4_;
  uVar2 = 0;
  switch(uVar1) {
  case 0:
    dVar4 = (double)(int)(uVar3 * 0xc5b);
    goto LAB_00145881;
  case 1:
    uVar2 = uVar3;
    break;
  case 0xfffffff8:
  case 0xffffffff:
    uVar2 = uVar3 * 0xc5b;
    break;
  case 0xfffffff9:
    uVar2 = hash_string((JSString *)ctx,0);
    break;
  case 0xfffffffa:
  case 0xfffffffb:
  case 0xfffffffc:
  case 0xfffffffd:
  case 0xfffffffe:
    break;
  default:
    uVar2 = 0;
    if (uVar1 != 7) break;
    dVar4 = (double)(~-(ulong)NAN((double)ctx) & (ulong)ctx |
                    -(ulong)NAN((double)ctx) & 0x7ff8000000000000);
LAB_00145881:
    uVar2 = ((uint)((ulong)dVar4 >> 0x20) ^ SUB84(dVar4,0)) * 0xc5b;
  }
  return uVar2 ^ uVar1;
}

Assistant:

static uint32_t map_hash_key(JSContext *ctx, JSValueConst key)
{
    uint32_t tag = JS_VALUE_GET_NORM_TAG(key);
    uint32_t h;
    double d;
    JSFloat64Union u;

    switch(tag) {
    case JS_TAG_BOOL:
        h = JS_VALUE_GET_INT(key);
        break;
    case JS_TAG_STRING:
        h = hash_string(JS_VALUE_GET_STRING(key), 0);
        break;
    case JS_TAG_OBJECT:
    case JS_TAG_SYMBOL:
        h = (uintptr_t)JS_VALUE_GET_PTR(key) * 3163;
        break;
    case JS_TAG_INT:
        d = JS_VALUE_GET_INT(key) * 3163;
        goto hash_float64;
    case JS_TAG_FLOAT64:
        d = JS_VALUE_GET_FLOAT64(key);
        /* normalize the NaN */
        if (isnan(d))
            d = JS_FLOAT64_NAN;
    hash_float64:
        u.d = d;
        h = (u.u32[0] ^ u.u32[1]) * 3163;
        break;
    default:
        h = 0; /* XXX: bignum support */
        break;
    }
    h ^= tag;
    return h;
}